

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Type * __thiscall
soul::heart::Parser::parseBoundedIntType(Type *__return_storage_ptr__,Parser *this,bool isWrap)

{
  int64_t iVar1;
  Type TStack_78;
  CompileMessage local_60;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275db3);
  iVar1 = parseLiteralInt(this);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29bc11);
  if (0x7ffffffd < iVar1 - 1U) {
    Errors::illegalSize<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_60);
    CompileMessage::~CompileMessage(&local_60);
  }
  if (isWrap) {
    Type::createWrappedInt(&TStack_78,(BoundedIntSize)iVar1);
  }
  else {
    Type::createClampedInt(&TStack_78,(BoundedIntSize)iVar1);
  }
  parseArrayTypeSuffixes(__return_storage_ptr__,this,&TStack_78);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_78.structure);
  return __return_storage_ptr__;
}

Assistant:

Type parseBoundedIntType (bool isWrap)
    {
        expect (HEARTOperator::lessThan);
        auto size = parseLiteralInt();
        expect (HEARTOperator::greaterThan);

        if (! Type::isLegalBoundedIntSize (size))
            throwError (Errors::illegalSize());

        auto boundedSize = static_cast<Type::BoundedIntSize> (size);
        return parseArrayTypeSuffixes (isWrap ? Type::createWrappedInt (boundedSize)
                                              : Type::createClampedInt (boundedSize));
    }